

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strscpy.c
# Opt level: O2

ssize_t uv__strscpy(char *d,char *s,size_t n)

{
  char cVar1;
  size_t sVar2;
  size_t sVar3;
  
  sVar3 = 0;
  while( true ) {
    if (n == sVar3) {
      if (n != 0) {
        d[n - 1] = '\0';
        return -7;
      }
      return 0;
    }
    cVar1 = s[sVar3];
    d[sVar3] = cVar1;
    if (cVar1 == '\0') break;
    sVar3 = sVar3 + 1;
  }
  sVar2 = 0xfffffffffffffff9;
  if (-1 < (long)sVar3) {
    sVar2 = sVar3;
  }
  return sVar2;
}

Assistant:

ssize_t uv__strscpy(char* d, const char* s, size_t n) {
  size_t i;

  for (i = 0; i < n; i++)
    if ('\0' == (d[i] = s[i]))
      return i > SSIZE_MAX ? UV_E2BIG : (ssize_t) i;

  if (i == 0)
    return 0;

  d[--i] = '\0';

  return UV_E2BIG;
}